

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall
wallet::CWallet::WithEncryptionKey
          (CWallet *this,
          function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)> cb)

{
  bool bVar1;
  function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)> *in_RSI;
  long in_FS_OFFSET;
  unique_lock<std::recursive_mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_28,&this->cs_wallet,
             "cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0xe61,false);
  bVar1 = std::function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)>
          ::operator()(in_RSI,&this->vMasterKey);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::WithEncryptionKey(std::function<bool (const CKeyingMaterial&)> cb) const
{
    LOCK(cs_wallet);
    return cb(vMasterKey);
}